

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O0

void __thiscall
llm_build_dbrx::llm_build_dbrx
          (llm_build_dbrx *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  uint uVar1;
  uint32_t uVar2;
  ggml_tensor *pgVar3;
  ggml_tensor *pgVar4;
  llm_graph_context *plVar5;
  ggml_tensor *pgVar6;
  ggml_tensor *kq_b;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  ggml_tensor *name;
  ggml_cgraph *n_expert;
  const_reference pvVar11;
  ggml_tensor *pgVar12;
  pointer plVar13;
  undefined8 in_RCX;
  long in_RSI;
  long in_RDI;
  ggml_tensor *ffn_inp;
  ggml_tensor *inp_out_ids;
  ggml_tensor *Vcur;
  ggml_tensor *Kcur;
  ggml_tensor *Qcur;
  ggml_tensor *inpSA;
  int il;
  llm_graph_input_attn_kv_unified *inp_attn;
  ggml_tensor *inp_pos;
  ggml_tensor *inpL;
  ggml_tensor *cur;
  int64_t n_embd_gqa;
  int64_t n_embd_head;
  ggml_tensor *in_stack_fffffffffffffd98;
  ggml_tensor *pgVar14;
  int il_00;
  llama_hparams *in_stack_fffffffffffffda0;
  ggml_tensor *in_stack_fffffffffffffda8;
  ggml_tensor *cur_00;
  ggml_tensor *in_stack_fffffffffffffdb0;
  ggml_tensor *mw;
  undefined4 in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdbc;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  ggml_tensor *in_stack_fffffffffffffdf0;
  ggml_tensor *in_stack_fffffffffffffdf8;
  ggml_tensor *in_stack_fffffffffffffe00;
  llm_graph_context *in_stack_fffffffffffffe40;
  ggml_tensor *in_stack_fffffffffffffe58;
  ggml_tensor *in_stack_fffffffffffffe60;
  ggml_tensor *in_stack_fffffffffffffe68;
  ggml_tensor *gate_inp;
  ggml_tensor *cur_01;
  llm_graph_context *this_00;
  llm_ffn_op_type type_op;
  ggml_tensor *in_stack_fffffffffffffea8;
  llm_graph_context *in_stack_fffffffffffffeb0;
  llama_expert_gating_func_type gating_op;
  int il_01;
  undefined8 in_stack_ffffffffffffff60;
  float kq_scale;
  ggml_tensor *in_stack_ffffffffffffff68;
  ggml_tensor *pgVar15;
  ggml_cgraph *gf_00;
  undefined4 in_stack_ffffffffffffff90;
  int iVar16;
  int iVar17;
  ggml_tensor *v_cur;
  ggml_tensor *in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc0;
  
  llm_graph_context::llm_graph_context
            ((llm_graph_context *)in_stack_fffffffffffffdb0,
             (llm_graph_params *)in_stack_fffffffffffffda8);
  uVar1 = *(uint *)(*(long *)(in_RDI + 8) + 0x24);
  uVar2 = llama_hparams::n_embd_v_gqa
                    (in_stack_fffffffffffffda0,(uint32_t)((ulong)in_stack_fffffffffffffd98 >> 0x20))
  ;
  if (uVar1 != *(uint *)(*(long *)(in_RDI + 8) + 0x20)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
               ,0x14d5,"GGML_ASSERT(%s) failed","n_embd_head == hparams.n_embd_head_k");
  }
  if (uVar1 != *(uint *)(*(long *)(in_RDI + 8) + 0x14)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
               ,0x14d6,"GGML_ASSERT(%s) failed","n_embd_head == hparams.n_rot");
  }
  pgVar3 = llm_graph_context::build_inp_embd(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  pgVar4 = llm_graph_context::build_inp_pos((llm_graph_context *)in_stack_fffffffffffffe00);
  plVar5 = (llm_graph_context *)
           llm_graph_context::build_attn_inp_kv_unified(in_stack_fffffffffffffe40);
  iVar16 = 0;
  while (kq_scale = (float)((ulong)in_stack_ffffffffffffff60 >> 0x20),
        iVar17 = (int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
        (long)iVar16 < *(long *)(in_RDI + 0x28)) {
    v_cur = pgVar3;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar16);
    llm_graph_context::build_norm
              ((llm_graph_context *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
               (ggml_tensor *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
               in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
               (llm_norm_type)((ulong)in_stack_fffffffffffffda0 >> 0x20),
               (int)in_stack_fffffffffffffda0);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
               &in_stack_fffffffffffffda0->vocab_only,iVar17);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar16);
    pgVar6 = llm_graph_context::build_lora_mm
                       ((llm_graph_context *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                        in_stack_fffffffffffffdf0);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
               &in_stack_fffffffffffffda0->vocab_only,iVar17);
    kq_b = (ggml_tensor *)
           ggml_clamp((ulong)*(uint *)(*(long *)(in_RDI + 8) + 0x18ec) ^ 0x8000000080000000,
                      *(undefined8 *)(in_RDI + 0xc0),pgVar6);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
               &in_stack_fffffffffffffda0->vocab_only,iVar17);
    uVar10 = *(undefined8 *)(in_RDI + 0xc0);
    uVar7 = ggml_view_2d(uVar10,kq_b,*(undefined8 *)(in_RDI + 0x20),(long)*(int *)(in_RDI + 0xa8),
                         kq_b->nb[1],0);
    uVar7 = ggml_cont(uVar10,uVar7);
    uVar10 = *(undefined8 *)(in_RDI + 0xc0);
    uVar8 = ggml_view_2d(uVar10,kq_b,uVar2,(long)*(int *)(in_RDI + 0xa8),kq_b->nb[1],
                         *(long *)(in_RDI + 0x20) << 2);
    uVar8 = ggml_cont(uVar10,uVar8);
    uVar10 = *(undefined8 *)(in_RDI + 0xc0);
    uVar9 = ggml_view_2d();
    uVar9 = ggml_cont(uVar10,uVar9);
    uVar10 = ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),uVar7,uVar1,
                             *(undefined8 *)(in_RDI + 0x48),(long)*(int *)(in_RDI + 0xa8));
    uVar7 = uVar10;
    uVar8 = ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),uVar8,uVar1,
                            *(undefined8 *)(in_RDI + 0x50),(long)*(int *)(in_RDI + 0xa8));
    il_01 = (int)uVar10;
    uVar10 = uVar8;
    name = (ggml_tensor *)
           ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),uVar9,uVar1,*(undefined8 *)(in_RDI + 0x50)
                           ,(long)*(int *)(in_RDI + 0xa8));
    gating_op = (llama_expert_gating_func_type)uVar8;
    n_expert = (ggml_cgraph *)
               ggml_rope_ext(*(undefined8 *)(in_RDI + 0xc0),uVar7,pgVar4,0,
                             *(undefined4 *)(in_RDI + 0x30),*(undefined4 *)(in_RDI + 0xb8));
    pgVar6 = (ggml_tensor *)
             ggml_rope_ext(*(undefined8 *)(in_RDI + 0xc0),uVar10,pgVar4,0,
                           *(undefined4 *)(in_RDI + 0x30),*(undefined4 *)(in_RDI + 0xb8));
    pgVar14 = pgVar6;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
               &in_stack_fffffffffffffda0->vocab_only,iVar17);
    type_op = (llm_ffn_op_type)pgVar6;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
               &in_stack_fffffffffffffda0->vocab_only,iVar17);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
               &in_stack_fffffffffffffda0->vocab_only,iVar17);
    this_00 = plVar5;
    pvVar11 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                        ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                         (long)iVar16);
    pgVar6 = pvVar11->wo;
    pgVar15 = name;
    pgVar12 = pgVar14;
    gf_00 = n_expert;
    sqrtf((float)uVar1);
    mw = (ggml_tensor *)0x0;
    cur_00 = (ggml_tensor *)0x0;
    gate_inp = name;
    cur_01 = pgVar14;
    iVar17 = iVar16;
    pgVar12 = llm_graph_context::build_attn
                        ((llm_graph_context *)CONCAT44(iVar16,in_stack_ffffffffffffff90),
                         (llm_graph_input_attn_kv_unified *)pgVar3,gf_00,pgVar12,pgVar15,
                         in_stack_ffffffffffffff68,pgVar4,v_cur,kq_b,in_stack_ffffffffffffffb8,
                         kq_scale,in_stack_ffffffffffffffc0);
    il_00 = (int)((ulong)pgVar14 >> 0x20);
    pgVar15 = pgVar12;
    if ((long)iVar17 == *(long *)(in_RDI + 0x28) + -1) {
      in_stack_fffffffffffffe68 =
           llm_graph_context::build_inp_out_ids((llm_graph_context *)in_stack_fffffffffffffdf0);
      in_stack_ffffffffffffff68 = in_stack_fffffffffffffe68;
      in_stack_fffffffffffffe60 =
           (ggml_tensor *)
           ggml_get_rows(*(undefined8 *)(in_RDI + 0xc0),pgVar15,in_stack_fffffffffffffe68);
      pgVar15 = in_stack_fffffffffffffe60;
      in_stack_fffffffffffffe58 =
           (ggml_tensor *)
           ggml_get_rows(*(undefined8 *)(in_RDI + 0xc0),pgVar3,in_stack_ffffffffffffff68);
      pgVar3 = in_stack_fffffffffffffe58;
    }
    uVar10 = ggml_add(*(undefined8 *)(in_RDI + 0xc0),pgVar15,pgVar3);
    in_stack_ffffffffffffff60 = uVar10;
    llm_graph_context::cb((llm_graph_context *)mw,cur_00,(char *)name,il_00);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar17);
    llm_graph_context::build_norm
              ((llm_graph_context *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
               (ggml_tensor *)CONCAT44(in_stack_fffffffffffffdbc,iVar16),mw,cur_00,
               (llm_norm_type)((ulong)name >> 0x20),(int)name);
    llm_graph_context::cb((llm_graph_context *)mw,cur_00,(char *)name,il_00);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar17);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar17);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar17);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar17);
    in_stack_fffffffffffffda0 = *(llama_hparams **)(in_RDI + 0x78);
    in_stack_fffffffffffffda8 = *(ggml_tensor **)(in_RDI + 0x80);
    in_stack_fffffffffffffdc0 = 0;
    in_stack_fffffffffffffdb8 = 1;
    in_stack_fffffffffffffdb0 = (ggml_tensor *)((ulong)mw & 0xffffffff00000000);
    in_stack_fffffffffffffd98 = (ggml_tensor *)0x0;
    pgVar3 = llm_graph_context::build_moe_ffn
                       (this_00,cur_01,gate_inp,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
                        in_stack_fffffffffffffe58,pgVar6,(int64_t)n_expert,(int64_t)pgVar12,type_op,
                        SUB81((ulong)uVar10 >> 0x38,0),SUB81((ulong)uVar10 >> 0x30,0),(float)uVar10,
                        gating_op,il_01);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
               &in_stack_fffffffffffffda0->vocab_only,
               (int)((ulong)in_stack_fffffffffffffd98 >> 0x20));
    ggml_add(*(undefined8 *)(in_RDI + 0xc0),pgVar3,in_stack_ffffffffffffff60);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
               &in_stack_fffffffffffffda0->vocab_only,
               (int)((ulong)in_stack_fffffffffffffd98 >> 0x20));
    in_stack_fffffffffffffe00 =
         llm_graph_context::build_cvec
                   ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,0);
    pgVar3 = in_stack_fffffffffffffe00;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
               &in_stack_fffffffffffffda0->vocab_only,
               (int)((ulong)in_stack_fffffffffffffd98 >> 0x20));
    iVar16 = iVar17 + 1;
  }
  pgVar4 = llm_graph_context::build_norm
                     ((llm_graph_context *)
                      CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                      (ggml_tensor *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                      in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                      (llm_norm_type)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                      (int)in_stack_fffffffffffffda0);
  pgVar3 = pgVar4;
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
             &in_stack_fffffffffffffda0->vocab_only,iVar17);
  plVar13 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x4e47e9);
  plVar13->t_embd = pgVar3;
  pgVar4 = llm_graph_context::build_lora_mm
                     ((llm_graph_context *)in_stack_fffffffffffffe00,pgVar4,
                      in_stack_fffffffffffffdf0);
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
             &in_stack_fffffffffffffda0->vocab_only,iVar17);
  pgVar3 = pgVar4;
  plVar13 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x4e486e);
  plVar13->t_logits = pgVar4;
  ggml_build_forward_expand(in_RCX,pgVar3);
  return;
}

Assistant:

llm_build_dbrx(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        const int64_t n_embd_head = hparams.n_embd_head_v;
        const int64_t n_embd_gqa  = hparams.n_embd_v_gqa();

        GGML_ASSERT(n_embd_head == hparams.n_embd_head_k);
        GGML_ASSERT(n_embd_head == hparams.n_rot);

        ggml_tensor * cur;
        ggml_tensor * inpL;

        inpL = build_inp_embd(model.tok_embd);

        // inp_pos - contains the positions
        ggml_tensor * inp_pos = build_inp_pos();

        auto * inp_attn = build_attn_inp_kv_unified();

        for (int il = 0; il < n_layer; ++il) {
            ggml_tensor * inpSA = inpL;

            // norm
            cur = build_norm(inpL,
                    model.layers[il].attn_norm, NULL,
                    LLM_NORM, il);
            cb(cur, "attn_norm", il);

            // self-attention
            {
                ggml_tensor * Qcur = nullptr;
                ggml_tensor * Kcur = nullptr;
                ggml_tensor * Vcur = nullptr;

                cur = build_lora_mm(model.layers[il].wqkv, cur);
                cb(cur, "wqkv", il);

                cur = ggml_clamp(ctx0, cur, -hparams.f_clamp_kqv, hparams.f_clamp_kqv);
                cb(cur, "wqkv_clamped", il);

                Qcur = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, n_embd,     n_tokens, cur->nb[1], 0*sizeof(float)*(n_embd)));
                Kcur = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, n_embd_gqa, n_tokens, cur->nb[1], 1*sizeof(float)*(n_embd)));
                Vcur = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, n_embd_gqa, n_tokens, cur->nb[1], 1*sizeof(float)*(n_embd + n_embd_gqa)));

                Qcur = ggml_reshape_3d(ctx0, Qcur, n_embd_head, n_head,    n_tokens);
                Kcur = ggml_reshape_3d(ctx0, Kcur, n_embd_head, n_head_kv, n_tokens);
                Vcur = ggml_reshape_3d(ctx0, Vcur, n_embd_head, n_head_kv, n_tokens);

                Qcur = ggml_rope_ext(
                        ctx0, Qcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                Kcur = ggml_rope_ext(
                        ctx0, Kcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Vcur, "Vcur", il);

                cur = build_attn(inp_attn, gf,
                        model.layers[il].wo, NULL,
                        Qcur, Kcur, Vcur, nullptr, nullptr, 1.0f/sqrtf(float(n_embd_head)), il);
            }

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur   = ggml_get_rows(ctx0,   cur, inp_out_ids);
                inpSA = ggml_get_rows(ctx0, inpSA, inp_out_ids);
            }

            ggml_tensor * ffn_inp = ggml_add(ctx0, cur, inpSA);
            cb(ffn_inp, "ffn_inp", il);

            // feed-forward network
            // MoE branch
            cur = build_norm(ffn_inp,
                    model.layers[il].attn_out_norm, NULL,
                    LLM_NORM, il);
            cb(cur, "attn_out_norm", il);

            cur = build_moe_ffn(cur,
                    model.layers[il].ffn_gate_inp,
                    model.layers[il].ffn_up_exps,
                    model.layers[il].ffn_gate_exps,
                    model.layers[il].ffn_down_exps,
                    nullptr,
                    n_expert, n_expert_used,
                    LLM_FFN_SILU, true,
                    false, 0.0,
                    LLAMA_EXPERT_GATING_FUNC_TYPE_SOFTMAX,
                    il);
            cb(cur, "ffn_moe_out", il);

            cur = ggml_add(ctx0, cur, ffn_inp);
            cb(cur, "ffn_out", il);

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        cur = inpL;

        cur = build_norm(cur,
                model.output_norm, NULL,
                LLM_NORM, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        // lm_head
        cur = build_lora_mm(model.output, cur);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }